

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts3PutDeltaVarint3(char **pp,int bDescIdx,sqlite3_int64 *piPrev,int *pbFirst,
                        sqlite3_int64 iVal)

{
  int iVar1;
  sqlite_int64 local_38;
  sqlite3_int64 iWrite;
  sqlite3_int64 iVal_local;
  int *pbFirst_local;
  sqlite3_int64 *piPrev_local;
  int bDescIdx_local;
  char **pp_local;
  
  if ((bDescIdx == 0) || (*pbFirst == 0)) {
    local_38 = iVal - *piPrev;
  }
  else {
    local_38 = *piPrev - iVal;
  }
  iVar1 = sqlite3Fts3PutVarint(*pp,local_38);
  *pp = *pp + iVar1;
  *piPrev = iVal;
  *pbFirst = 1;
  return;
}

Assistant:

static void fts3PutDeltaVarint3(
  char **pp,                      /* IN/OUT: Output pointer */
  int bDescIdx,                   /* True for descending docids */
  sqlite3_int64 *piPrev,          /* IN/OUT: Previous value written to list */
  int *pbFirst,                   /* IN/OUT: True after first int written */
  sqlite3_int64 iVal              /* Write this value to the list */
){
  sqlite3_int64 iWrite;
  if( bDescIdx==0 || *pbFirst==0 ){
    iWrite = iVal - *piPrev;
  }else{
    iWrite = *piPrev - iVal;
  }
  assert( *pbFirst || *piPrev==0 );
  assert( *pbFirst==0 || iWrite>0 );
  *pp += sqlite3Fts3PutVarint(*pp, iWrite);
  *piPrev = iVal;
  *pbFirst = 1;
}